

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

CodeLocationRange *
soul::SourceCodeUtilities::findRangeOfASTObject
          (CodeLocationRange *__return_storage_ptr__,ASTObject *object)

{
  SourceCodeText *pSVar1;
  char *pcVar2;
  FindLexicalRangeVisitor v;
  undefined **local_50;
  SourceCodeText *local_48;
  char *pcStack_40;
  SourceCodeText *local_38;
  char *pcStack_30;
  
  local_50 = &PTR__FindLexicalRangeVisitor_002f5678;
  local_48 = (SourceCodeText *)0x0;
  pcStack_40 = (char *)0x0;
  pcStack_30 = (char *)0x0;
  pSVar1 = (object->context).location.sourceCode.object;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  local_38 = pSVar1;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
  pcVar2 = (object->context).location.location.data;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  local_48 = pSVar1;
  pcStack_30 = pcVar2;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)0x0);
  pcStack_40 = pcVar2;
  findRangeOfASTObject(soul::AST::ASTObject&)::FindLexicalRangeVisitor::visitObject(soul::AST::
  ASTObject__(&local_50,object);
  (__return_storage_ptr__->start).sourceCode.object = local_48;
  if (local_48 != (SourceCodeText *)0x0) {
    (local_48->super_RefCountedObject).refCount = (local_48->super_RefCountedObject).refCount + 1;
  }
  (__return_storage_ptr__->start).location.data = pcStack_40;
  (__return_storage_ptr__->end).sourceCode.object = local_38;
  if (local_38 != (SourceCodeText *)0x0) {
    (local_38->super_RefCountedObject).refCount = (local_38->super_RefCountedObject).refCount + 1;
  }
  (__return_storage_ptr__->end).location.data = pcStack_30;
  local_50 = &PTR__FindLexicalRangeVisitor_002f5678;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_38);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_48);
  return __return_storage_ptr__;
}

Assistant:

CodeLocationRange SourceCodeUtilities::findRangeOfASTObject (AST::ASTObject& object)
{
    struct FindLexicalRangeVisitor  : public ASTVisitor
    {
        void visitObject (AST::ASTObject& o) override
        {
            ASTVisitor::visitObject (o);

            auto loc = o.context.location;

            if (loc.location < range.start.location)  range.start = loc;
            if (loc.location > range.end.location)    range.end = loc;
        }

        CodeLocationRange range;
    };

    FindLexicalRangeVisitor v;
    v.range.start = v.range.end = object.context.location;
    v.visitObject (object);
    return v.range;
}